

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rprog.c
# Opt level: O0

void pulse_prog_elven_star(ROOM_INDEX_DATA *room)

{
  ROOM_INDEX_DATA *room_local;
  
  return;
}

Assistant:

void pulse_prog_elven_star(ROOM_INDEX_DATA *room)
{
	/*
	OBJ_DATA *obj;
	CHAR_DATA *ch=room->people;
	int nMatch=0;

	for(obj=room->contents; obj != nullptr; obj=obj->next_content)
	{
		if(obj->pIndexData->vnum == (4637 || 4638 || 4639 || 4640 || 4641))
		{
			nMatch++;
			continue;
		}
		if(nMatch > 4)
		{
			if(ch != nullptr)
			{
				act("As the star is completed, you hear a noise nearby.",ch,0,0,TO_ROOM);
				act("Their purpose fulfilled, the gems disintegrate.",ch,0,0,TO_ROOM);
			}

			extract_obj(obj);
			break;
		}
	}
	*/

	return;
}